

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

_Bool ask_word(char *word_res,size_t min_len,size_t max_len)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  ulong local_28;
  size_t n;
  size_t max_len_local;
  size_t min_len_local;
  char *word_res_local;
  
  do {
    printf("Please enter a word of at least %zu letters: ",min_len);
    fgets(word_res,(int)max_len,_stdin);
    if (*word_res == '\n') break;
    sVar2 = strlen(word_res);
    if (sVar2 - 1 < min_len) {
      printf("Your word is too small!\n");
    }
    sVar2 = strlen(word_res);
  } while (sVar2 - 1 < min_len);
  local_28 = 0;
  while( true ) {
    bVar3 = false;
    if ((local_28 < max_len) && (bVar3 = false, word_res[local_28] != '\0')) {
      bVar3 = word_res[local_28] != '\n';
    }
    if (!bVar3) break;
    iVar1 = toupper((int)word_res[local_28]);
    word_res[local_28] = (char)iVar1;
    local_28 = local_28 + 1;
  }
  return *word_res != '\n';
}

Assistant:

bool ask_word(char* word_res, const size_t min_len, const size_t max_len) {
  do {
    printf("Please enter a word of at least %zu letters: ", min_len);
    fgets(word_res, (int)max_len, stdin);
    if (word_res[0] == '\n') break;
    if (strlen(word_res) - 1 < min_len) {
      printf("Your word is too small!\n");
    }
  } while (strlen(word_res) - 1 < min_len);

  for (size_t n = 0; n < max_len && word_res[n] != 0 && word_res[n] != '\n'; n++) {
    word_res[n] = (char)toupper(word_res[n]);
  }

  return word_res[0] != '\n';
}